

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t,duckdb::BinaryStandardOperatorWrapper,duckdb::BitwiseShiftLeftOperator,bool,false,true>
               (hugeint_t *ldata,hugeint_t *rdata,hugeint_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  unsigned_long *puVar1;
  hugeint_t shift;
  hugeint_t shift_00;
  hugeint_t input;
  hugeint_t input_00;
  hugeint_t input_01;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  hugeint_t hVar10;
  int64_t in_stack_ffffffffffffffa8;
  idx_t iVar11;
  uint64_t in_stack_ffffffffffffffb0;
  hugeint_t *phVar12;
  hugeint_t *phVar13;
  int64_t in_stack_ffffffffffffffb8;
  ulong uVar14;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      lVar5 = 8;
      do {
        input_01.upper = in_stack_ffffffffffffffb8;
        input_01.lower = in_stack_ffffffffffffffb0;
        hVar10.upper = in_stack_ffffffffffffffa8;
        hVar10.lower = (uint64_t)ldata;
        hVar10 = BitwiseShiftLeftOperator::
                 Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>(input_01,hVar10);
        *(uint64_t *)((long)result_data + lVar5 + -8) = hVar10.lower;
        *(int64_t *)((long)&result_data->lower + lVar5) = hVar10.upper;
        lVar5 = lVar5 + 0x10;
        count = count - 1;
      } while (count != 0);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar14 = count + 0x3f >> 6;
    uVar3 = 0;
    uVar7 = 0;
    iVar11 = count;
    phVar13 = result_data;
    do {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      phVar12 = phVar13;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar2 = uVar7 + 0x40;
        if (count <= uVar7 + 0x40) {
          uVar2 = count;
        }
LAB_01afbce6:
        uVar9 = uVar7;
        result_data = phVar13;
        if (uVar7 < uVar2) {
          uVar4 = uVar7 << 4 | 8;
          count = iVar11;
          do {
            input.upper = uVar14;
            input.lower = (uint64_t)phVar12;
            shift.upper = count;
            shift.lower = (uint64_t)ldata;
            hVar10 = BitwiseShiftLeftOperator::
                     Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>(input,shift);
            *(uint64_t *)((long)phVar13 + (uVar4 - 8)) = hVar10.lower;
            *(int64_t *)((long)&phVar13->lower + uVar4) = hVar10.upper;
            uVar7 = uVar7 + 1;
            uVar4 = uVar4 + 0x10;
            uVar9 = uVar2;
            iVar11 = count;
          } while (uVar2 != uVar7);
        }
      }
      else {
        uVar4 = puVar1[uVar3];
        uVar2 = uVar7 + 0x40;
        if (count <= uVar7 + 0x40) {
          uVar2 = count;
        }
        uVar9 = uVar2;
        if (uVar4 != 0) {
          if (uVar4 == 0xffffffffffffffff) goto LAB_01afbce6;
          uVar9 = uVar7;
          if (uVar7 < uVar2) {
            uVar8 = uVar7 << 4 | 8;
            uVar6 = 0;
            count = iVar11;
            do {
              if ((uVar4 >> (uVar6 & 0x3f) & 1) != 0) {
                input_00.upper = uVar14;
                input_00.lower = (uint64_t)phVar13;
                shift_00.upper = count;
                shift_00.lower = (uint64_t)ldata;
                hVar10 = BitwiseShiftLeftOperator::
                         Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>
                                   (input_00,shift_00);
                *(uint64_t *)((long)result_data + (uVar8 - 8)) = hVar10.lower;
                *(int64_t *)((long)&result_data->lower + uVar8) = hVar10.upper;
              }
              uVar6 = uVar6 + 1;
              uVar8 = uVar8 + 0x10;
              uVar9 = uVar2;
              iVar11 = count;
              phVar12 = phVar13;
            } while (uVar2 - uVar7 != uVar6);
          }
        }
      }
      uVar3 = uVar3 + 1;
      uVar7 = uVar9;
      phVar13 = phVar12;
    } while (uVar3 != uVar14);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}